

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_paramhlp.c
# Opt level: O1

ParameterError str2offset(curl_off_t *val,char *str)

{
  ParameterError PVar1;
  int *piVar2;
  long lVar3;
  size_t sVar4;
  char *endptr;
  char *local_20;
  
  PVar1 = PARAM_NEGATIVE_NUMERIC;
  if (*str != '-') {
    piVar2 = __errno_location();
    *piVar2 = 0;
    lVar3 = strtol(str,&local_20,0);
    *val = lVar3;
    if ((1 < lVar3 + 0x8000000000000001U) || (PVar1 = PARAM_NUMBER_TOO_LARGE, *piVar2 != 0x22)) {
      if ((local_20 == str) || (sVar4 = strlen(str), local_20 != str + sVar4)) {
        PVar1 = PARAM_BAD_NUMERIC;
      }
      else {
        PVar1 = PARAM_OK;
      }
    }
  }
  return PVar1;
}

Assistant:

ParameterError str2offset(curl_off_t *val, const char *str)
{
  char *endptr;
  if(str[0] == '-')
    /* offsets aren't negative, this indicates weird input */
    return PARAM_NEGATIVE_NUMERIC;

#if(SIZEOF_CURL_OFF_T > SIZEOF_LONG)
  {
    CURLofft offt = curlx_strtoofft(str, &endptr, 0, val);
    if(CURL_OFFT_FLOW == offt)
      return PARAM_NUMBER_TOO_LARGE;
    else if(CURL_OFFT_INVAL == offt)
      return PARAM_BAD_NUMERIC;
  }
#else
  errno = 0;
  *val = strtol(str, &endptr, 0);
  if((*val == LONG_MIN || *val == LONG_MAX) && errno == ERANGE)
    return PARAM_NUMBER_TOO_LARGE;
#endif
  if((endptr != str) && (endptr == str + strlen(str)))
    return PARAM_OK;

  return PARAM_BAD_NUMERIC;
}